

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O2

void __thiscall
CustomServer::on_client_disconnect
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[INFO] Client ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," has been disconnected.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void on_client_disconnect(std::shared_ptr<blcl::net::connection<MsgType>> client) override {
        std::cout << "[INFO] Client " << client->get_id() << " has been disconnected." << std::endl;
    }